

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jccoefct.c
# Opt level: O0

boolean compress_data(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_c_coef_controller *pjVar3;
  jpeg_component_info *pjVar4;
  forward_DCT_ptr p_Var5;
  uint uVar6;
  boolean bVar7;
  long in_RSI;
  j_compress_ptr in_RDI;
  forward_DCT_ptr forward_DCT;
  jpeg_component_info *compptr;
  JDIMENSION xpos;
  JDIMENSION ypos;
  int blockcnt;
  int yoffset;
  int yindex;
  int ci;
  int bi;
  int blkn;
  JDIMENSION last_iMCU_row;
  JDIMENSION last_MCU_col;
  JDIMENSION MCU_col_num;
  my_coef_ptr coef;
  JDIMENSION local_64;
  JDIMENSION local_48;
  int local_40;
  int local_3c;
  int local_38;
  JDIMENSION local_34;
  int local_30;
  uint local_24;
  
  pjVar3 = in_RDI->coef;
  uVar6 = in_RDI->MCUs_per_row - 1;
  JVar1 = in_RDI->total_iMCU_rows;
  local_40 = *(int *)&pjVar3[1].compress_data;
  do {
    if (*(int *)((long)&pjVar3[1].compress_data + 4) <= local_40) {
      *(int *)&pjVar3[1].start_pass = *(int *)&pjVar3[1].start_pass + 1;
      start_iMCU_row(in_RDI);
      return 1;
    }
    for (local_24 = *(uint *)((long)&pjVar3[1].start_pass + 4); local_24 <= uVar6;
        local_24 = local_24 + 1) {
      local_30 = 0;
      for (local_38 = 0; local_38 < in_RDI->comps_in_scan; local_38 = local_38 + 1) {
        pjVar4 = in_RDI->cur_comp_info[local_38];
        p_Var5 = in_RDI->fdct->forward_DCT[pjVar4->component_index];
        if (local_24 < uVar6) {
          local_64 = pjVar4->MCU_width;
        }
        else {
          local_64 = pjVar4->last_col_width;
        }
        iVar2 = pjVar4->MCU_sample_width;
        local_48 = local_40 * pjVar4->DCT_v_scaled_size;
        for (local_3c = 0; local_3c < pjVar4->MCU_height; local_3c = local_3c + 1) {
          if ((*(uint *)&pjVar3[1].start_pass < JVar1 - 1) ||
             (local_40 + local_3c < pjVar4->last_row_height)) {
            (*p_Var5)(in_RDI,pjVar4,*(JSAMPARRAY *)(in_RSI + (long)pjVar4->component_index * 8),
                      (JBLOCKROW)(&pjVar3[2].start_pass)[local_30],local_48,local_24 * iVar2,
                      local_64);
            if ((int)local_64 < pjVar4->MCU_width) {
              memset((&pjVar3[2].start_pass)[(int)(local_30 + local_64)],0,
                     (long)(int)(pjVar4->MCU_width - local_64) << 7);
              for (local_34 = local_64; (int)local_34 < pjVar4->MCU_width; local_34 = local_34 + 1)
              {
                *(undefined2 *)(&pjVar3[2].start_pass)[(int)(local_30 + local_34)] =
                     *(undefined2 *)(&pjVar3[2].start_pass)[(int)(local_30 + local_34 + -1)];
              }
            }
          }
          else {
            memset((&pjVar3[2].start_pass)[local_30],0,(long)pjVar4->MCU_width << 7);
            for (local_34 = 0; (int)local_34 < pjVar4->MCU_width; local_34 = local_34 + 1) {
              *(undefined2 *)(&pjVar3[2].start_pass)[(int)(local_30 + local_34)] =
                   *(undefined2 *)(&pjVar3[2].start_pass)[local_30 + -1];
            }
          }
          local_30 = pjVar4->MCU_width + local_30;
          local_48 = pjVar4->DCT_v_scaled_size + local_48;
        }
      }
      bVar7 = (*in_RDI->entropy->encode_mcu)(in_RDI,(JBLOCKROW *)(pjVar3 + 2));
      if (bVar7 == 0) {
        *(int *)&pjVar3[1].compress_data = local_40;
        *(uint *)((long)&pjVar3[1].start_pass + 4) = local_24;
        return 0;
      }
    }
    *(undefined4 *)((long)&pjVar3[1].start_pass + 4) = 0;
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

METHODDEF(boolean)
compress_data (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, bi, ci, yindex, yoffset, blockcnt;
  JDIMENSION ypos, xpos;
  jpeg_component_info *compptr;
  forward_DCT_ptr forward_DCT;

  /* Loop to write as much as one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num <= last_MCU_col;
	 MCU_col_num++) {
      /* Determine where data comes from in input_buf and do the DCT thing.
       * Each call on forward_DCT processes a horizontal row of DCT blocks
       * as wide as an MCU; we rely on having allocated the MCU_buffer[] blocks
       * sequentially.  Dummy blocks at the right or bottom edge are filled in
       * specially.  The data in them does not matter for image reconstruction,
       * so we fill them with values that will encode to the smallest amount of
       * data, viz: all zeroes in the AC entries, DC entries equal to previous
       * block's DC value.  (Thanks to Thomas Kinsman for this idea.)
       */
      blkn = 0;
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	forward_DCT = cinfo->fdct->forward_DCT[compptr->component_index];
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	xpos = MCU_col_num * compptr->MCU_sample_width;
	ypos = yoffset * compptr->DCT_v_scaled_size;
	/* ypos == (yoffset+yindex) * DCTSIZE */
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yoffset+yindex < compptr->last_row_height) {
	    (*forward_DCT) (cinfo, compptr,
			    input_buf[compptr->component_index],
			    coef->MCU_buffer[blkn],
			    ypos, xpos, (JDIMENSION) blockcnt);
	    if (blockcnt < compptr->MCU_width) {
	      /* Create some dummy blocks at the right edge of the image. */
	      FMEMZERO((void FAR *) coef->MCU_buffer[blkn + blockcnt],
		       (compptr->MCU_width - blockcnt) * SIZEOF(JBLOCK));
	      for (bi = blockcnt; bi < compptr->MCU_width; bi++) {
		coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn+bi-1][0][0];
	      }
	    }
	  } else {
	    /* Create a row of dummy blocks at the bottom of the image. */
	    FMEMZERO((void FAR *) coef->MCU_buffer[blkn],
		     compptr->MCU_width * SIZEOF(JBLOCK));
	    for (bi = 0; bi < compptr->MCU_width; bi++) {
	      coef->MCU_buffer[blkn+bi][0][0] = coef->MCU_buffer[blkn-1][0][0];
	    }
	  }
	  blkn += compptr->MCU_width;
	  ypos += compptr->DCT_v_scaled_size;
	}
      }
      /* Try to write the MCU.  In event of a suspension failure, we will
       * re-DCT the MCU on restart (a bit inefficient, could be fixed...)
       */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, coef->MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}